

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 tcu::sampleLevelArray1DOffset
               (ConstPixelBufferAccess *levels,int numLevels,Sampler *sampler,float s,float lod,
               IVec2 *offset)

{
  int iVar1;
  int iVar2;
  IVec2 *offset_00;
  FilterMode filter;
  int iVar3;
  Vector<float,_4> *res;
  int iVar4;
  int iVar5;
  undefined4 in_register_00000034;
  Sampler *sampler_00;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float in_XMM1_Db;
  Vec4 VVar10;
  Vec4 t0;
  Vec4 t1;
  ConstPixelBufferAccess local_58;
  
  sampler_00 = (Sampler *)CONCAT44(in_register_00000034,numLevels);
  iVar1 = offset[1].m_data[(ulong)(lod <= (float)offset[2].m_data[1]) + 1];
  filter = (FilterMode)offset;
  switch(iVar1) {
  case 0:
    offset_00 = (IVec2 *)0x0;
    break;
  case 1:
    offset_00 = (IVec2 *)&DAT_00000001;
    break;
  case 2:
  case 4:
    iVar4 = (int)sampler + -1;
    fVar8 = ceilf(lod + 0.5);
    iVar5 = (int)fVar8 + -1;
    if (iVar5 < iVar4) {
      iVar4 = iVar5;
    }
    iVar2 = 0;
    if (-1 < iVar5) {
      iVar2 = iVar4;
    }
    offset_00 = (IVec2 *)(ulong)(iVar1 == 4);
    sampler_00 = (Sampler *)(&sampler_00->wrapS + (long)iVar2 * 10);
    break;
  case 3:
  case 5:
    iVar5 = (int)sampler + -1;
    fVar6 = floorf(lod);
    iVar2 = (int)fVar6;
    iVar4 = iVar5;
    if (iVar2 < iVar5) {
      iVar4 = iVar2;
    }
    iVar3 = 0;
    if (-1 < iVar2) {
      iVar3 = iVar4;
    }
    if (iVar3 + 1 <= iVar5) {
      iVar5 = iVar3 + 1;
    }
    fVar6 = lod - fVar6;
    ConstPixelBufferAccess::sample1DOffset
              (&local_58,(Sampler *)(&sampler_00->wrapS + (long)iVar3 * 10),filter,s,
               (IVec2 *)(ulong)(iVar1 == 5));
    ConstPixelBufferAccess::sample1DOffset
              ((ConstPixelBufferAccess *)(local_58.m_size.m_data + 2),
               (Sampler *)(&sampler_00->wrapS + (long)iVar5 * 10),filter,s,
               (IVec2 *)(ulong)(iVar1 == 5));
    fVar7 = 1.0 - fVar6;
    fVar8 = fVar7 * (float)local_58.m_format.order;
    fVar9 = fVar7 * (float)local_58.m_format.type;
    lod = fVar6 * (float)local_58.m_size.m_data[2] + fVar8;
    in_XMM1_Db = fVar6 * (float)local_58.m_pitch.m_data[0] + fVar9;
    (levels->m_format).order = (ChannelOrder)lod;
    (levels->m_format).type = (ChannelType)in_XMM1_Db;
    (levels->m_size).m_data[0] =
         (int)(fVar6 * (float)local_58.m_pitch.m_data[1] + fVar7 * (float)local_58.m_size.m_data[0])
    ;
    (levels->m_size).m_data[1] =
         (int)(fVar6 * (float)local_58.m_pitch.m_data[2] + fVar7 * (float)local_58.m_size.m_data[1])
    ;
    goto LAB_00a36a66;
  default:
    fVar8 = 0.0;
    fVar9 = 0.0;
    (levels->m_format).order = R;
    (levels->m_format).type = SNORM_INT8;
    (levels->m_size).m_data[0] = 0;
    (levels->m_size).m_data[1] = 0;
    goto LAB_00a36a66;
  }
  VVar10 = ConstPixelBufferAccess::sample1DOffset(levels,sampler_00,filter,s,offset_00);
  lod = VVar10.m_data[2];
  in_XMM1_Db = VVar10.m_data[3];
  fVar8 = VVar10.m_data[0];
  fVar9 = VVar10.m_data[1];
LAB_00a36a66:
  VVar10.m_data[1] = fVar9;
  VVar10.m_data[0] = fVar8;
  VVar10.m_data[3] = in_XMM1_Db;
  VVar10.m_data[2] = lod;
  return (Vec4)VVar10.m_data;
}

Assistant:

Vec4 sampleLevelArray1DOffset (const ConstPixelBufferAccess* levels, int numLevels, const Sampler& sampler, float s, float lod, const IVec2& offset)
{
	bool					magnified	= lod <= sampler.lodThreshold;
	Sampler::FilterMode		filterMode	= magnified ? sampler.magFilter : sampler.minFilter;

	switch (filterMode)
	{
		case Sampler::NEAREST:	return levels[0].sample1DOffset(sampler, filterMode, s, offset);
		case Sampler::LINEAR:	return levels[0].sample1DOffset(sampler, filterMode, s, offset);

		case Sampler::NEAREST_MIPMAP_NEAREST:
		case Sampler::LINEAR_MIPMAP_NEAREST:
		{
			int					maxLevel	= (int)numLevels-1;
			int					level		= deClamp32((int)deFloatCeil(lod + 0.5f) - 1, 0, maxLevel);
			Sampler::FilterMode	levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_NEAREST) ? Sampler::LINEAR : Sampler::NEAREST;

			return levels[level].sample1DOffset(sampler, levelFilter, s, offset);
		}

		case Sampler::NEAREST_MIPMAP_LINEAR:
		case Sampler::LINEAR_MIPMAP_LINEAR:
		{
			int					maxLevel	= (int)numLevels-1;
			int					level0		= deClamp32((int)deFloatFloor(lod), 0, maxLevel);
			int					level1		= de::min(maxLevel, level0 + 1);
			Sampler::FilterMode	levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_LINEAR) ? Sampler::LINEAR : Sampler::NEAREST;
			float				f			= deFloatFrac(lod);
			tcu::Vec4			t0			= levels[level0].sample1DOffset(sampler, levelFilter, s, offset);
			tcu::Vec4			t1			= levels[level1].sample1DOffset(sampler, levelFilter, s, offset);

			return t0*(1.0f - f) + t1*f;
		}

		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}